

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall embree::Image::convertToRGBA8(Image *this,uchar *dest)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [16];
  undefined6 uVar10;
  undefined8 uVar11;
  unkbyte10 Var12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [14];
  short sVar15;
  undefined4 uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  Color4 c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  char cVar2;
  char cVar3;
  char cVar4;
  
  uVar22 = this->height;
  if (uVar22 != 0) {
    uVar21 = this->width;
    uVar23 = 0;
    do {
      if (uVar21 == 0) {
        uVar21 = 0;
      }
      else {
        uVar22 = 0;
        do {
          (*(this->super_RefCount)._vptr_RefCount[4])(&local_48,this,uVar22,uVar23);
          iVar17 = (int)(local_48 * 255.0);
          iVar18 = (int)(fStack_44 * 255.0);
          cVar24 = (char)((uint)iVar18 >> 0x10);
          iVar19 = (int)(fStack_40 * 255.0);
          cVar25 = (char)((uint)iVar19 >> 0x10);
          iVar20 = (int)(fStack_3c * 255.0);
          cVar26 = (char)((uint)iVar20 >> 0x10);
          uVar10 = CONCAT15((char)((uint)iVar18 >> 8),CONCAT14((char)iVar18,iVar17));
          uVar11 = CONCAT17((char)((uint)iVar18 >> 0x18),CONCAT16(cVar24,uVar10));
          Var12 = CONCAT19((char)((uint)iVar19 >> 8),CONCAT18((char)iVar19,uVar11));
          auVar13[10] = cVar25;
          auVar13._0_10_ = Var12;
          auVar13[0xb] = (char)((uint)iVar19 >> 0x18);
          auVar14[0xc] = (char)iVar20;
          auVar14._0_12_ = auVar13;
          auVar14[0xd] = (char)((uint)iVar20 >> 8);
          auVar9[0xe] = cVar26;
          auVar9._0_14_ = auVar14;
          auVar9[0xf] = (char)((uint)iVar20 >> 0x18);
          sVar5 = (short)iVar17;
          cVar1 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar17 - (0xff < sVar5);
          sVar5 = (short)((uint)iVar17 >> 0x10);
          sVar6 = (short)((uint6)uVar10 >> 0x20);
          cVar2 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar18 - (0xff < sVar6);
          sVar6 = (short)((ulong)uVar11 >> 0x30);
          sVar7 = (short)((unkuint10)Var12 >> 0x40);
          cVar3 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar19 - (0xff < sVar7);
          sVar7 = auVar13._10_2_;
          sVar8 = auVar14._12_2_;
          cVar4 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar20 - (0xff < sVar8);
          sVar8 = auVar9._14_2_;
          sVar15 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * (char)((uint)iVar17 >> 0x10) -
                            (0xff < sVar5),cVar1);
          uVar16 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * cVar24 - (0xff < sVar6),
                            CONCAT12(cVar2,sVar15));
          uVar10 = CONCAT15((0 < sVar7) * (sVar7 < 0x100) * cVar25 - (0xff < sVar7),
                            CONCAT14(cVar3,uVar16));
          sVar5 = (short)((uint)uVar16 >> 0x10);
          sVar6 = (short)((uint6)uVar10 >> 0x20);
          sVar7 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * cVar26 - (0xff < sVar8),
                                   CONCAT16(cVar4,uVar10)) >> 0x30);
          *(uint *)(dest + (uVar21 * uVar23 + uVar22) * 4) =
               CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                        CONCAT12((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                 CONCAT11((0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5),
                                          (0 < sVar15) * (sVar15 < 0x100) * cVar1 - (0xff < sVar15))
                                ));
          uVar22 = uVar22 + 1;
          uVar21 = this->width;
        } while (uVar22 < uVar21);
        uVar22 = this->height;
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < uVar22);
  }
  return;
}

Assistant:

void convertToRGBA8(unsigned char *dest)
    {
      for (size_t y=0;y<height;y++)
	for (size_t x=0;x<width;x++)
	  {
	    size_t offset = 4 * (y * width + x);
	    Color4 c = get(x,y);
	    dest[offset+0] = (unsigned char)(c.r * 255.0f);
	    dest[offset+1] = (unsigned char)(c.g * 255.0f);
	    dest[offset+2] = (unsigned char)(c.b * 255.0f);
	    dest[offset+3] = (unsigned char)(c.a * 255.0f);
	  }
    }